

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_lobster.cpp
# Opt level: O0

bool __thiscall flatbuffers::lobster::LobsterGenerator::generate(LobsterGenerator *this)

{
  bool bVar1;
  char *pcVar2;
  reference ppEVar3;
  reference ppSVar4;
  string local_110;
  StructDef *local_f0;
  StructDef *struct_def_1;
  __normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
  local_e0;
  const_iterator it_2;
  StructDef *struct_def;
  __normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
  local_c8;
  const_iterator it_1;
  EnumDef *enum_def;
  __normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
  local_b0;
  const_iterator it;
  allocator<char> local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_30 [8];
  string code;
  LobsterGenerator *this_local;
  
  code.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"// ",&local_91);
  pcVar2 = BaseGenerator::FlatBuffersGeneratedWarning();
  std::operator+(&local_70,&local_90,pcVar2);
  std::operator+(&local_50,&local_70,"\nimport flatbuffers\n\n");
  std::__cxx11::string::operator+=((string *)local_30,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  local_b0._M_current =
       (EnumDef **)
       std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>::begin
                 (&(((this->super_BaseGenerator).parser_)->enums_).vec);
  while( true ) {
    enum_def = (EnumDef *)
               std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>::end
                         (&(((this->super_BaseGenerator).parser_)->enums_).vec);
    bVar1 = __gnu_cxx::operator!=
                      (&local_b0,
                       (__normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
                        *)&enum_def);
    if (!bVar1) break;
    ppEVar3 = __gnu_cxx::
              __normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
              ::operator*(&local_b0);
    it_1._M_current = (StructDef **)*ppEVar3;
    GenEnum(this,(EnumDef *)it_1._M_current,(string *)local_30);
    __gnu_cxx::
    __normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
    ::operator++(&local_b0);
  }
  local_c8._M_current =
       (StructDef **)
       std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::begin
                 (&(((this->super_BaseGenerator).parser_)->structs_).vec);
  while( true ) {
    struct_def = (StructDef *)
                 std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::
                 end(&(((this->super_BaseGenerator).parser_)->structs_).vec);
    bVar1 = __gnu_cxx::operator!=
                      (&local_c8,
                       (__normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
                        *)&struct_def);
    if (!bVar1) break;
    ppSVar4 = __gnu_cxx::
              __normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
              ::operator*(&local_c8);
    it_2._M_current = (StructDef **)*ppSVar4;
    GenStructPreDecl(this,(StructDef *)it_2._M_current,(string *)local_30);
    __gnu_cxx::
    __normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
    ::operator++(&local_c8);
  }
  local_e0._M_current =
       (StructDef **)
       std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::begin
                 (&(((this->super_BaseGenerator).parser_)->structs_).vec);
  while( true ) {
    struct_def_1 = (StructDef *)
                   std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                   ::end(&(((this->super_BaseGenerator).parser_)->structs_).vec);
    bVar1 = __gnu_cxx::operator!=
                      (&local_e0,
                       (__normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
                        *)&struct_def_1);
    if (!bVar1) break;
    ppSVar4 = __gnu_cxx::
              __normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
              ::operator*(&local_e0);
    local_f0 = *ppSVar4;
    GenStruct(this,local_f0,(string *)local_30);
    __gnu_cxx::
    __normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
    ::operator++(&local_e0);
  }
  BaseGenerator::GeneratedFileName
            (&local_110,&this->super_BaseGenerator,(this->super_BaseGenerator).path_,
             (this->super_BaseGenerator).file_name_,&((this->super_BaseGenerator).parser_)->opts);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  bVar1 = SaveFile(pcVar2,(string *)local_30,false);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)local_30);
  return bVar1;
}

Assistant:

bool generate() {
    std::string code;
    code += std::string("// ") + FlatBuffersGeneratedWarning() +
            "\nimport flatbuffers\n\n";
    for (auto it = parser_.enums_.vec.begin(); it != parser_.enums_.vec.end();
         ++it) {
      auto &enum_def = **it;
      GenEnum(enum_def, &code);
    }
    for (auto it = parser_.structs_.vec.begin();
         it != parser_.structs_.vec.end(); ++it) {
      auto &struct_def = **it;
      GenStructPreDecl(struct_def, &code);
    }
    for (auto it = parser_.structs_.vec.begin();
         it != parser_.structs_.vec.end(); ++it) {
      auto &struct_def = **it;
      GenStruct(struct_def, &code);
    }
    return SaveFile(GeneratedFileName(path_, file_name_, parser_.opts).c_str(),
                    code, false);
  }